

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge)

{
  bool bVar1;
  byte local_29;
  TEdge *local_20;
  TEdge *e;
  TEdge *edge_local;
  Clipper *this_local;
  
  edge->prevInAEL = (TEdge *)0x0;
  edge->nextInAEL = (TEdge *)0x0;
  if (this->m_ActiveEdges == (TEdge *)0x0) {
    this->m_ActiveEdges = edge;
  }
  else {
    bVar1 = E2InsertsBeforeE1(this->m_ActiveEdges,edge);
    if (bVar1) {
      edge->nextInAEL = this->m_ActiveEdges;
      this->m_ActiveEdges->prevInAEL = edge;
      this->m_ActiveEdges = edge;
    }
    else {
      local_20 = this->m_ActiveEdges;
      while( true ) {
        local_29 = 0;
        if (local_20->nextInAEL != (TEdge *)0x0) {
          bVar1 = E2InsertsBeforeE1(local_20->nextInAEL,edge);
          local_29 = bVar1 ^ 0xff;
        }
        if ((local_29 & 1) == 0) break;
        local_20 = local_20->nextInAEL;
      }
      edge->nextInAEL = local_20->nextInAEL;
      if (local_20->nextInAEL != (TEdge *)0x0) {
        local_20->nextInAEL->prevInAEL = edge;
      }
      edge->prevInAEL = local_20;
      local_20->nextInAEL = edge;
    }
  }
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge)
{
  edge->prevInAEL = 0;
  edge->nextInAEL = 0;
  if( !m_ActiveEdges )
  {
    m_ActiveEdges = edge;
  }
  else if( E2InsertsBeforeE1(*m_ActiveEdges, *edge) )
  {
    edge->nextInAEL = m_ActiveEdges;
    m_ActiveEdges->prevInAEL = edge;
    m_ActiveEdges = edge;
  } else
  {
    TEdge* e = m_ActiveEdges;
    while( e->nextInAEL  && !E2InsertsBeforeE1(*e->nextInAEL , *edge) )
      e = e->nextInAEL;
    edge->nextInAEL = e->nextInAEL;
    if( e->nextInAEL ) e->nextInAEL->prevInAEL = edge;
    edge->prevInAEL = e;
    e->nextInAEL = edge;
  }
}